

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

void gl4cts::CopyImage::write3Channel<unsigned_short,5u,6u,5u,11u,5u,0u>
               (GLuint channel,GLdouble value,GLubyte *pixel)

{
  uint uVar1;
  TestError *this;
  byte bVar2;
  
  if (channel < 3) {
    bVar2 = (byte)(channel << 4);
    uVar1 = (uint)(0x1f003f001f >> (bVar2 & 0x3f));
    *(ushort *)pixel =
         *(ushort *)pixel |
         (ushort)(((int)((double)(uVar1 & 0xffff) * value) & uVar1) <<
                 ((byte)(0x5000bL >> (bVar2 & 0x3f)) & 0x1f));
    return;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,"Invalid channel",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
             ,0x867);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void write3Channel(GLuint channel, GLdouble value, GLubyte* pixel)
{
	T  mask   = 0;
	T  max	= 0;
	T  off	= 0;
	T* ptr	= (T*)pixel;
	T  result = 0;

	static const T max_1 = (1 << size_1) - 1;
	static const T max_2 = (1 << size_2) - 1;
	static const T max_3 = (1 << size_3) - 1;

	switch (channel)
	{
	case 0:
		mask = max_1;
		max  = max_1;
		off  = off_1;
		break;
	case 1:
		mask = max_2;
		max  = max_2;
		off  = off_2;
		break;
	case 2:
		mask = max_3;
		max  = max_3;
		off  = off_3;
		break;
	default:
		TCU_FAIL("Invalid channel");
		break;
	}

	const GLdouble d_max   = (GLdouble)max;
	const GLdouble d_value = value * d_max;
	const T		   t_value = (T)d_value;

	result = (T)((t_value & mask) << off);

	*ptr |= result;
}